

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O1

void amqp_messenger_do_work(AMQP_MESSENGER_HANDLE messenger_handle)

{
  MESSAGE_RECEIVER_STATE MVar1;
  AMQP_MESSENGER_CONFIG *pAVar2;
  int iVar3;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  LINK_HANDLE pLVar4;
  MESSAGE_SENDER_HANDLE message_sender;
  MESSAGE_RECEIVER_HANDLE message_receiver;
  AMQP_MESSENGER_STATE_CHANGED_CALLBACK p_Var5;
  AMQP_MESSENGER_STATE AVar6;
  AMQP_MESSENGER_STATE previous_state;
  AMQP_MESSENGER_STATE AVar7;
  void *pvVar8;
  char *pcVar9;
  _Bool is_timed_out;
  _Bool local_a;
  _Bool local_9;
  
  if (messenger_handle == (AMQP_MESSENGER_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
      return;
    }
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
               ,"amqp_messenger_do_work",0x566,1,"Invalid argument (messenger_handle is NULL)");
    return;
  }
  if (messenger_handle->state == AMQP_MESSENGER_STATE_STARTING) {
    switch(messenger_handle->message_sender_current_state) {
    case MESSAGE_SENDER_STATE_IDLE:
      if (messenger_handle->message_sender != (MESSAGE_SENDER_HANDLE)0x0)
      goto switchD_0013cfef_caseD_4;
      break;
    case MESSAGE_SENDER_STATE_OPENING:
      iVar3 = is_timeout_reached(messenger_handle->last_message_sender_state_change_time,300,
                                 &local_a);
      if (iVar3 != 0) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) goto LAB_0013d123;
        pcVar9 = "messenger failed to start (failed to verify messagesender start timeout)";
        iVar3 = 0x527;
        goto LAB_0013d118;
      }
      if (local_a == true) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar9 = 
          "messenger failed to start (messagesender failed to start within expected timeout (%d secs))"
          ;
          iVar3 = 0x52c;
          goto LAB_0013d118;
        }
        goto LAB_0013d123;
      }
      break;
    case MESSAGE_SENDER_STATE_OPEN:
      messenger_handle->state = AMQP_MESSENGER_STATE_STARTED;
      pAVar2 = messenger_handle->config;
      if ((pAVar2 == (AMQP_MESSENGER_CONFIG *)0x0) ||
         (p_Var5 = pAVar2->on_state_changed_callback,
         p_Var5 == (AMQP_MESSENGER_STATE_CHANGED_CALLBACK)0x0)) break;
      pvVar8 = pAVar2->on_state_changed_context;
      AVar6 = AMQP_MESSENGER_STATE_STARTED;
      AVar7 = AMQP_MESSENGER_STATE_STARTING;
LAB_0013d14c:
      (*p_Var5)(pvVar8,AVar7,AVar6);
      break;
    case MESSAGE_SENDER_STATE_CLOSING:
    case MESSAGE_SENDER_STATE_ERROR:
switchD_0013cfef_caseD_4:
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar9 = "messagesender reported unexpected state %d while messenger is starting";
        iVar3 = 0x536;
LAB_0013d118:
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                   ,"process_state_changes",iVar3,1,pcVar9);
      }
      goto LAB_0013d123;
    }
  }
  else {
    if (messenger_handle->state != AMQP_MESSENGER_STATE_STARTED) goto switchD_0013cfef_default;
    if (messenger_handle->message_sender_current_state == MESSAGE_SENDER_STATE_OPEN) {
      if (messenger_handle->message_receiver == (MESSAGE_RECEIVER_HANDLE)0x0)
      goto switchD_0013cfef_default;
      MVar1 = messenger_handle->message_receiver_current_state;
      if ((MVar1 == MESSAGE_RECEIVER_STATE_IDLE) || (MVar1 == MESSAGE_RECEIVER_STATE_ERROR)) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar9 = "messagereceiver reported unexpected state %d while messenger is starting";
          iVar3 = 0x515;
          goto LAB_0013d118;
        }
      }
      else {
        if (MVar1 != MESSAGE_RECEIVER_STATE_OPENING) goto switchD_0013cfef_default;
        iVar3 = is_timeout_reached(messenger_handle->last_message_receiver_state_change_time,300,
                                   &local_9);
        if (iVar3 == 0) {
          if (local_9 != true) goto switchD_0013cfef_default;
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
            pcVar9 = 
            "messenger got an error (messagereceiver failed to start within expected timeout (%d secs))"
            ;
            iVar3 = 0x50e;
            goto LAB_0013d118;
          }
        }
        else {
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
            pcVar9 = "messenger got an error (failed to verify messagereceiver start timeout)";
            iVar3 = 0x509;
            goto LAB_0013d118;
          }
        }
      }
    }
    else {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar9 = "messagesender reported unexpected state %d while messenger was started";
        iVar3 = 0x4ff;
        goto LAB_0013d118;
      }
    }
LAB_0013d123:
    AVar7 = messenger_handle->state;
    if (AVar7 != AMQP_MESSENGER_STATE_ERROR) {
      messenger_handle->state = AMQP_MESSENGER_STATE_ERROR;
      pAVar2 = messenger_handle->config;
      if ((pAVar2 != (AMQP_MESSENGER_CONFIG *)0x0) &&
         (p_Var5 = pAVar2->on_state_changed_callback,
         p_Var5 != (AMQP_MESSENGER_STATE_CHANGED_CALLBACK)0x0)) {
        pvVar8 = pAVar2->on_state_changed_context;
        AVar6 = AMQP_MESSENGER_STATE_ERROR;
        goto LAB_0013d14c;
      }
    }
  }
switchD_0013cfef_default:
  if (messenger_handle->state != AMQP_MESSENGER_STATE_STARTED) {
    if ((messenger_handle->state != AMQP_MESSENGER_STATE_STARTING) ||
       (messenger_handle->message_sender != (MESSAGE_SENDER_HANDLE)0x0)) goto LAB_0013d468;
    pAVar2 = messenger_handle->config;
    pLVar4 = create_link(false,messenger_handle->session_handle,&pAVar2->send_link,
                         pAVar2->iothub_host_fqdn,pAVar2->device_id,pAVar2->module_id);
    messenger_handle->sender_link = pLVar4;
    if (pLVar4 == (LINK_HANDLE)0x0) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                   ,"create_message_sender",0x285,1,"Failed creating the message sender link");
      }
    }
    else {
      message_sender =
           messagesender_create(pLVar4,on_message_sender_state_changed_callback,messenger_handle);
      messenger_handle->message_sender = message_sender;
      if (message_sender == (MESSAGE_SENDER_HANDLE)0x0) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar9 = "Failed creating the message sender (messagesender_create failed)";
          iVar3 = 0x28a;
LAB_0013d31e:
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                     ,"create_message_sender",iVar3,1,pcVar9);
        }
      }
      else {
        iVar3 = messagesender_open(message_sender);
        if (iVar3 == 0) goto LAB_0013d468;
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar9 = "Failed opening the AMQP message sender.";
          iVar3 = 0x292;
          goto LAB_0013d31e;
        }
      }
      destroy_message_sender(messenger_handle);
    }
    AVar7 = messenger_handle->state;
    if (AVar7 != AMQP_MESSENGER_STATE_ERROR) {
      messenger_handle->state = AMQP_MESSENGER_STATE_ERROR;
      pAVar2 = messenger_handle->config;
      if ((pAVar2 != (AMQP_MESSENGER_CONFIG *)0x0) &&
         (pAVar2->on_state_changed_callback != (AMQP_MESSENGER_STATE_CHANGED_CALLBACK)0x0)) {
        (*pAVar2->on_state_changed_callback)
                  (pAVar2->on_state_changed_context,AVar7,AMQP_MESSENGER_STATE_ERROR);
      }
    }
    goto LAB_0013d468;
  }
  if ((messenger_handle->receive_messages == true) &&
     (messenger_handle->message_receiver == (MESSAGE_RECEIVER_HANDLE)0x0)) {
    pAVar2 = messenger_handle->config;
    pLVar4 = create_link(true,messenger_handle->session_handle,&pAVar2->receive_link,
                         pAVar2->iothub_host_fqdn,pAVar2->device_id,pAVar2->module_id);
    messenger_handle->receiver_link = pLVar4;
    if (pLVar4 == (LINK_HANDLE)0x0) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                   ,"create_message_receiver",0x341,1,"Failed creating the message receiver link");
      }
    }
    else {
      message_receiver =
           messagereceiver_create
                     (pLVar4,on_message_receiver_state_changed_callback,messenger_handle);
      messenger_handle->message_receiver = message_receiver;
      if (message_receiver == (MESSAGE_RECEIVER_HANDLE)0x0) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar9 = "Failed creating the message receiver (messagereceiver_create failed)";
          iVar3 = 0x346;
LAB_0013d417:
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                     ,"create_message_receiver",iVar3,1,pcVar9);
        }
      }
      else {
        iVar3 = messagereceiver_open
                          (message_receiver,on_message_received_internal_callback,messenger_handle);
        if (iVar3 == 0) goto LAB_0013d205;
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar9 = "Failed opening the AMQP message receiver.";
          iVar3 = 0x34c;
          goto LAB_0013d417;
        }
      }
      destroy_message_receiver(messenger_handle);
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                 ,"manage_amqp_messengers",0x550,1,
                 "amqp_messenger_do_work warning (failed creating the message receiver [%s])",
                 messenger_handle->config->device_id);
    }
  }
  else {
LAB_0013d205:
    if ((messenger_handle->receive_messages == false) &&
       (messenger_handle->message_receiver != (MESSAGE_RECEIVER_HANDLE)0x0)) {
      destroy_message_receiver(messenger_handle);
    }
  }
LAB_0013d468:
  if (messenger_handle->state == AMQP_MESSENGER_STATE_STARTED) {
    message_queue_do_work(messenger_handle->send_queue);
  }
  if (messenger_handle->max_send_error_count <= messenger_handle->send_error_count) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                 ,"handle_errors_and_timeouts",0x55d,1,
                 "Reached max number of consecutive send failures (%s, %lu)",
                 messenger_handle->config->device_id,messenger_handle->max_send_error_count);
    }
    AVar7 = messenger_handle->state;
    if (AVar7 != AMQP_MESSENGER_STATE_ERROR) {
      messenger_handle->state = AMQP_MESSENGER_STATE_ERROR;
      pAVar2 = messenger_handle->config;
      if ((pAVar2 != (AMQP_MESSENGER_CONFIG *)0x0) &&
         (pAVar2->on_state_changed_callback != (AMQP_MESSENGER_STATE_CHANGED_CALLBACK)0x0)) {
        (*pAVar2->on_state_changed_callback)
                  (pAVar2->on_state_changed_context,AVar7,AMQP_MESSENGER_STATE_ERROR);
      }
    }
  }
  return;
}

Assistant:

void amqp_messenger_do_work(AMQP_MESSENGER_HANDLE messenger_handle)
{
    if (messenger_handle == NULL)
    {
        LogError("Invalid argument (messenger_handle is NULL)");
    }
    else
    {
        AMQP_MESSENGER_INSTANCE* msgr = (AMQP_MESSENGER_INSTANCE*)messenger_handle;

        process_state_changes(msgr);

        manage_amqp_messengers(msgr);

        if (msgr->state == AMQP_MESSENGER_STATE_STARTED)
        {
            message_queue_do_work(msgr->send_queue);
        }

        handle_errors_and_timeouts(msgr);
    }
}